

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

uchar __thiscall pstore::serialize::archive::buffer_reader::get<unsigned_char>(buffer_reader *this)

{
  uchar uVar1;
  type result;
  buffer_reader *this_local;
  
  if (this->last_ < this->first_ + 1) {
    raise<std::errc,char[44]>
              (no_buffer_space,(char (*) [44])"Attempted to read past the end of a buffer.");
  }
  uVar1 = *this->first_;
  this->first_ = this->first_ + 1;
  return uVar1;
}

Assistant:

T get () {
                    typename std::remove_const<T>::type result;
                    static_assert (std::is_standard_layout<T>::value,
                                   "buffer_reader(T&) can only read standard-layout types");
                    if (first_ + sizeof (T) > last_) {
                        raise (std::errc::no_buffer_space,
                               "Attempted to read past the end of a buffer.");
                    }
                    std::memcpy (&result, first_, sizeof (T));
                    first_ += sizeof (T);
                    return result;
                }